

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O3

void __thiscall
BmsParseDuplicateHeaderException::BmsParseDuplicateHeaderException
          (BmsParseDuplicateHeaderException *this,uint line,string *header)

{
  pointer pcVar1;
  
  (this->super_BmsParseException).line_ = line;
  (this->super_BmsParseException).super_BmsException._vptr_BmsException =
       (_func_int **)&PTR_Message_abi_cxx11__00143c80;
  (this->header_)._M_dataplus._M_p = (pointer)&(this->header_).field_2;
  pcVar1 = (header->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->header_,pcVar1,pcVar1 + header->_M_string_length);
  return;
}

Assistant:

BmsParseException::BmsParseException( unsigned int line ) :
line_( line )
{
}